

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O2

void PredictBatch(int mode,int x_start,int y,int num_pixels,uint32_t *current,uint32_t *upper,
                 uint32_t *out)

{
  VP8LPredictorAddSubFunc UNRECOVERED_JUMPTABLE;
  uint32_t *puVar1;
  VP8LPredictorAddSubFunc *pp_Var2;
  
  if (x_start == 0) {
    pp_Var2 = VP8LPredictorsSub + 2;
    puVar1 = upper;
    if (y == 0) {
      pp_Var2 = VP8LPredictorsSub;
      puVar1 = (uint32_t *)0x0;
    }
    x_start = 1;
    (**pp_Var2)(current,puVar1,1,out);
    out = out + 1;
    num_pixels = num_pixels + -1;
  }
  if (y == 0) {
    puVar1 = (uint32_t *)0x0;
    UNRECOVERED_JUMPTABLE = VP8LPredictorsSub[1];
  }
  else {
    puVar1 = upper + x_start;
    UNRECOVERED_JUMPTABLE = VP8LPredictorsSub[mode];
  }
  (*UNRECOVERED_JUMPTABLE)(current + x_start,puVar1,num_pixels,out);
  return;
}

Assistant:

static WEBP_INLINE void PredictBatch(int mode, int x_start, int y,
                                     int num_pixels, const uint32_t* current,
                                     const uint32_t* upper, uint32_t* out) {
  if (x_start == 0) {
    if (y == 0) {
      // ARGB_BLACK.
      VP8LPredictorsSub[0](current, NULL, 1, out);
    } else {
      // Top one.
      VP8LPredictorsSub[2](current, upper, 1, out);
    }
    ++x_start;
    ++out;
    --num_pixels;
  }
  if (y == 0) {
    // Left one.
    VP8LPredictorsSub[1](current + x_start, NULL, num_pixels, out);
  } else {
    VP8LPredictorsSub[mode](current + x_start, upper + x_start, num_pixels,
                            out);
  }
}